

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_dir.cc
# Opt level: O0

int add_cert_dir(BY_DIR *ctx,char *dir,int type)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  size_t sVar3;
  BY_DIR_ENTRY *pBVar4;
  size_t sVar5;
  stack_st_BY_DIR_ENTRY *psVar6;
  CRYPTO_MUTEX *pCVar7;
  stack_st_BY_DIR_HASH *psVar8;
  char *pcVar9;
  BY_DIR_ENTRY *ent;
  char *p;
  char *ss;
  char *s;
  size_t len;
  size_t j;
  int type_local;
  char *dir_local;
  BY_DIR *ctx_local;
  
  if ((dir == (char *)0x0) || (ent = (BY_DIR_ENTRY *)dir, ss = dir, *dir == '\0')) {
    ERR_put_error(0xb,0,0x6e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_dir.cc"
                  ,0x90);
    ctx_local._4_4_ = 0;
  }
  else {
    do {
      if (((ent->lock).__size[0] == ':') || (pcVar2 = ss, (ent->lock).__size[0] == '\0')) {
        pcVar2 = (ent->lock).__size + 1;
        __n = (long)ent - (long)ss;
        if (__n != 0) {
          for (len = 0; sVar3 = sk_BY_DIR_ENTRY_num(ctx->dirs), len < sVar3; len = len + 1) {
            pBVar4 = sk_BY_DIR_ENTRY_value(ctx->dirs,len);
            sVar5 = strlen(pBVar4->dir);
            if ((sVar5 == __n) && (iVar1 = strncmp(pBVar4->dir,ss,__n), iVar1 == 0)) break;
          }
          sVar3 = sk_BY_DIR_ENTRY_num(ctx->dirs);
          if (sVar3 <= len) {
            if (ctx->dirs == (stack_st_BY_DIR_ENTRY *)0x0) {
              psVar6 = sk_BY_DIR_ENTRY_new_null();
              ctx->dirs = psVar6;
              if (ctx->dirs == (stack_st_BY_DIR_ENTRY *)0x0) {
                return 0;
              }
            }
            pCVar7 = (CRYPTO_MUTEX *)OPENSSL_malloc(0x50);
            if (pCVar7 == (CRYPTO_MUTEX *)0x0) {
              return 0;
            }
            CRYPTO_MUTEX_init(pCVar7);
            *(int *)((long)pCVar7 + 0x40) = type;
            psVar8 = sk_BY_DIR_HASH_new(by_dir_hash_cmp);
            *(stack_st_BY_DIR_HASH **)((long)pCVar7 + 0x48) = psVar8;
            pcVar9 = OPENSSL_strndup(ss,__n);
            pCVar7[1].__align = (long)pcVar9;
            if (((pCVar7[1].__align == 0) || (*(long *)((long)pCVar7 + 0x48) == 0)) ||
               (sVar3 = sk_BY_DIR_ENTRY_push(ctx->dirs,(BY_DIR_ENTRY *)&pCVar7->__data), sVar3 == 0)
               ) {
              by_dir_entry_free((BY_DIR_ENTRY *)&pCVar7->__data);
              return 0;
            }
          }
        }
      }
      ss = pcVar2;
      pCVar7 = &ent->lock;
      ent = (BY_DIR_ENTRY *)((long)&ent->lock + 1);
    } while (pCVar7->__size[0] != '\0');
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int add_cert_dir(BY_DIR *ctx, const char *dir, int type) {
  size_t j, len;
  const char *s, *ss, *p;

  if (dir == NULL || !*dir) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_DIRECTORY);
    return 0;
  }

  s = dir;
  p = s;
  do {
    if (*p == DIR_HASH_SEPARATOR || *p == '\0') {
      BY_DIR_ENTRY *ent;
      ss = s;
      s = p + 1;
      len = p - ss;
      if (len == 0) {
        continue;
      }
      for (j = 0; j < sk_BY_DIR_ENTRY_num(ctx->dirs); j++) {
        ent = sk_BY_DIR_ENTRY_value(ctx->dirs, j);
        if (strlen(ent->dir) == len && strncmp(ent->dir, ss, len) == 0) {
          break;
        }
      }
      if (j < sk_BY_DIR_ENTRY_num(ctx->dirs)) {
        continue;
      }
      if (ctx->dirs == NULL) {
        ctx->dirs = sk_BY_DIR_ENTRY_new_null();
        if (!ctx->dirs) {
          return 0;
        }
      }
      ent = reinterpret_cast<BY_DIR_ENTRY *>(
          OPENSSL_malloc(sizeof(BY_DIR_ENTRY)));
      if (!ent) {
        return 0;
      }
      CRYPTO_MUTEX_init(&ent->lock);
      ent->dir_type = type;
      ent->hashes = sk_BY_DIR_HASH_new(by_dir_hash_cmp);
      ent->dir = OPENSSL_strndup(ss, len);
      if (ent->dir == NULL || ent->hashes == NULL ||
          !sk_BY_DIR_ENTRY_push(ctx->dirs, ent)) {
        by_dir_entry_free(ent);
        return 0;
      }
    }
  } while (*p++ != '\0');
  return 1;
}